

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_predict_intra_block
               (MACROBLOCKD *xd,BLOCK_SIZE sb_size,int enable_intra_edge_filter,int wpx,int hpx,
               TX_SIZE tx_size,PREDICTION_MODE mode,int angle_delta,int use_palette,
               FILTER_INTRA_MODE filter_intra_mode,uint8_t *ref,int ref_stride,uint8_t *dst,
               int dst_stride,int col_off,int row_off,int plane)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  int iVar10;
  MB_MODE_INFO *pMVar11;
  intra_pred_fn (*pap_Var12) [19];
  intra_high_pred_fn (*pap_Var13) [19];
  uint16_t uVar14;
  uint uVar15;
  uint uVar16;
  uint16_t *puVar17;
  long lVar18;
  bool bVar19;
  BLOCK_SIZE BVar20;
  byte bVar21;
  uint16_t uVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  uint angle;
  uint uVar26;
  size_t __n;
  ulong uVar27;
  long lVar28;
  uint16_t *puVar29;
  size_t sVar30;
  uint8_t **ppuVar31;
  byte *pbVar32;
  uint8_t *puVar33;
  uint16_t *puVar34;
  uint uVar35;
  size_t sVar36;
  byte bVar37;
  byte *pbVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  int iVar42;
  uint16_t *puVar43;
  byte bVar44;
  int iVar45;
  ulong uVar46;
  undefined7 in_register_00000089;
  size_t __n_00;
  _func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **pp_Var47;
  ulong uVar48;
  byte bVar49;
  uint uVar50;
  int iVar51;
  int k;
  uint uVar52;
  byte *pbVar53;
  uint bs1;
  long lVar54;
  bool bVar55;
  byte bVar56;
  BLOCK_SIZE BVar57;
  int local_c04;
  uint local_c00;
  int local_be0;
  uint local_bac;
  uint16_t left_data_2 [160];
  uint16_t auStack_9f8 [16];
  ushort local_9d8 [143];
  ushort uStack_8ba;
  uint16_t left_data [160];
  
  uVar27 = (ulong)(uint)((int)CONCAT71(in_register_00000089,tx_size) * 4);
  uVar26 = *(uint *)((long)tx_size_wide + uVar27);
  __n = (size_t)(int)uVar26;
  bs1 = *(uint *)((long)tx_size_high + uVar27);
  sVar36 = (size_t)(int)bs1;
  pMVar11 = *xd->mi;
  uVar50 = (uint)xd->cur_buf->flags >> 3;
  if (use_palette != 0) {
    uVar3 = xd->color_index_map_offset[plane != 0];
    puVar33 = xd->plane[plane != 0].color_index_map;
    if ((uVar50 & 1) == 0) {
      uVar27 = 0;
      uVar41 = 0;
      if (0 < (int)uVar26) {
        uVar41 = (ulong)uVar26;
      }
      uVar46 = 0;
      if (0 < (int)bs1) {
        uVar46 = (ulong)bs1;
      }
      iVar42 = col_off * 4 + row_off * wpx * 4;
      for (; uVar27 != uVar46; uVar27 = uVar27 + 1) {
        for (uVar48 = 0; uVar41 != uVar48; uVar48 = uVar48 + 1) {
          dst[uVar48] = (uint8_t)(pMVar11->palette_mode_info).palette_colors
                                 [(long)(plane << 3) +
                                  (ulong)puVar33[(long)(iVar42 + (int)uVar48) + (ulong)uVar3]];
        }
        dst = dst + dst_stride;
        iVar42 = iVar42 + wpx;
      }
      return;
    }
    lVar54 = (long)dst * 2;
    uVar27 = 0;
    uVar41 = 0;
    if (0 < (int)uVar26) {
      uVar41 = (ulong)uVar26;
    }
    uVar46 = (ulong)bs1;
    if ((int)bs1 < 1) {
      uVar46 = uVar27;
    }
    iVar42 = col_off * 4 + row_off * wpx * 4;
    for (; uVar27 != uVar46; uVar27 = uVar27 + 1) {
      for (uVar48 = 0; uVar41 != uVar48; uVar48 = uVar48 + 1) {
        *(uint16_t *)(lVar54 + uVar48 * 2) =
             (pMVar11->palette_mode_info).palette_colors
             [(long)(plane << 3) + (ulong)puVar33[(long)(iVar42 + (int)uVar48) + (ulong)uVar3]];
      }
      lVar54 = lVar54 + (long)dst_stride * 2;
      iVar42 = iVar42 + wpx;
    }
    return;
  }
  iVar42 = xd->plane[plane].subsampling_y;
  bVar56 = 1;
  cVar1 = '\x01';
  if (row_off == 0) {
    cVar1 = *(char *)((long)xd->block_ref_scale_factors + (ulong)(iVar42 != 0) * 2 + -0x48);
  }
  uVar27 = CONCAT71(in_register_00000089,tx_size) & 0xffffffff;
  iVar51 = xd->plane[plane].subsampling_x;
  if (col_off == 0) {
    bVar56 = *(byte *)((long)xd->block_ref_scale_factors + (ulong)(iVar51 != 0) * 2 + -0x47);
  }
  bVar49 = (byte)iVar51;
  uVar39 = wpx + col_off * -4 + (xd->mb_to_right_edge >> (bVar49 + 3 & 0x1f));
  bVar37 = (byte)iVar42;
  uVar25 = hpx + row_off * -4 + (xd->mb_to_bottom_edge >> (bVar37 + 3 & 0x1f));
  local_bac = uVar39;
  if ((int)uVar26 < (int)uVar39) {
    local_bac = uVar26;
  }
  __n_00 = 0;
  if (cVar1 != '\0') {
    __n_00 = (size_t)local_bac;
  }
  uVar23 = uVar25;
  if ((int)bs1 < (int)uVar25) {
    uVar23 = bs1;
  }
  uVar41 = (ulong)uVar23;
  if (bVar56 == 0) {
    uVar41 = 0;
  }
  uVar46 = (ulong)mode;
  lVar54 = (long)ref_stride;
  iVar45 = (int)uVar41;
  iVar10 = (int)__n_00;
  if (7 < (byte)(mode - 1) && filter_intra_mode == '\x05') {
    if ((uVar50 & 1) != 0) {
      iVar42 = xd->bd;
      puVar17 = (uint16_t *)((long)dst * 2);
      bVar56 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar46];
      puVar43 = (uint16_t *)((long)ref * 2 + lVar54 * -2);
      puVar34 = (uint16_t *)((long)ref * 2 + -2);
      uVar3 = (ushort)(0x80 << ((char)iVar42 - 8U & 0x1f));
      if (((bVar56 & 4) != 0 || iVar45 != 0) && ((bVar56 & 2) != 0 || iVar10 != 0)) {
        if ((bVar56 & 2) != 0) {
          for (lVar28 = 0; lVar28 != 0xa0; lVar28 = lVar28 + 1) {
            left_data[lVar28] = uVar3 | 1;
          }
          if (iVar45 < 1) {
            if (0 < iVar10) {
              uVar14 = *puVar43;
              for (sVar30 = 0; sVar36 != sVar30; sVar30 = sVar30 + 1) {
                left_data[sVar30 + 0x10] = uVar14;
              }
            }
          }
          else {
            puVar29 = puVar34;
            for (uVar48 = 0; uVar41 != uVar48; uVar48 = uVar48 + 1) {
              left_data[uVar48 + 0x10] = *puVar29;
              puVar29 = puVar29 + lVar54;
            }
            if (iVar45 < (int)bs1) {
              uVar14 = left_data[uVar41 + 0xf];
              for (lVar54 = 0; (int)(bs1 - iVar45) != lVar54; lVar54 = lVar54 + 1) {
                left_data[uVar41 + lVar54 + 0x10] = uVar14;
              }
            }
          }
        }
        puVar29 = left_data_2 + 0x10;
        if ((bVar56 & 4) != 0) {
          for (lVar54 = 0; lVar54 != 0xa0; lVar54 = lVar54 + 1) {
            left_data_2[lVar54] = uVar3 - 1;
          }
          if (iVar10 < 1) {
            if (0 < iVar45) {
              uVar14 = *puVar34;
              for (sVar36 = 0; __n != sVar36; sVar36 = sVar36 + 1) {
                left_data_2[sVar36 + 0x10] = uVar14;
              }
            }
          }
          else {
            memcpy(puVar29,puVar43,__n_00 * 2);
            if (iVar10 < (int)uVar26) {
              uVar14 = left_data_2[__n_00 + 0xf];
              for (lVar54 = 0; (int)(uVar26 - iVar10) != lVar54; lVar54 = lVar54 + 1) {
                puVar29[__n_00 + lVar54] = uVar14;
              }
            }
          }
        }
        if ((bVar56 & 0x10) != 0) {
          if ((iVar10 < 1) || (iVar45 < 1)) {
            if (iVar10 < 1) {
              left_data_2[0xf] = uVar3;
              left_data[0xf] = uVar3;
              if (0 < iVar45) {
                left_data_2[0xf] = *puVar34;
                left_data[0xf] = left_data_2[0xf];
              }
            }
            else {
              left_data_2[0xf] = *puVar43;
              left_data[0xf] = *puVar43;
            }
          }
          else {
            left_data_2[0xf] = puVar43[-1];
            left_data[0xf] = puVar43[-1];
          }
        }
        if (mode == '\0') {
          pap_Var13 = dc_pred_high[0 < iVar45] + (0 < iVar10);
        }
        else {
          pap_Var13 = pred_high + uVar46;
        }
        (*(*pap_Var13)[uVar27])(puVar17,(long)dst_stride,puVar29,left_data + 0x10,iVar42);
        return;
      }
      if ((bVar56 & 2) == 0) {
        if (iVar45 < 1) {
          uVar14 = uVar3 - 1;
        }
        else {
          uVar14 = *puVar34;
        }
      }
      else if (iVar10 < 1) {
        uVar14 = uVar3 | 1;
      }
      else {
        uVar14 = *puVar43;
      }
      uVar50 = 0;
      uVar26 = 0;
      if (0 < (int)bs1) {
        uVar26 = bs1;
      }
      for (; uVar50 != uVar26; uVar50 = uVar50 + 1) {
        for (sVar36 = 0; __n != sVar36; sVar36 = sVar36 + 1) {
          puVar17[sVar36] = uVar14;
        }
        puVar17 = puVar17 + dst_stride;
      }
      return;
    }
    pbVar53 = ref + -lVar54;
    pbVar38 = ref + -1;
    bVar56 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar46];
    if (((bVar56 & 4) == 0 && iVar45 == 0) || ((bVar56 & 2) == 0 && iVar10 == 0)) {
      if ((bVar56 & 2) == 0) {
        pbVar53 = pbVar38;
        if (iVar45 < 1) {
          bVar56 = 0x7f;
          goto LAB_002375e6;
        }
      }
      else if (iVar10 < 1) {
        bVar56 = 0x81;
        goto LAB_002375e6;
      }
      bVar56 = *pbVar53;
LAB_002375e6:
      uVar26 = 0;
      if (0 < (int)bs1) {
        uVar26 = bs1;
      }
      while (uVar26 != 0) {
        memset(dst,(uint)bVar56,__n);
        dst = dst + dst_stride;
        uVar26 = uVar26 - 1;
      }
      return;
    }
    puVar34 = left_data + 8;
    if ((bVar56 & 2) != 0) {
      memset(left_data,0x81,0xa0);
      if (iVar45 < 1) {
        if (0 < iVar10) {
          bVar49 = *pbVar53;
          goto LAB_00237678;
        }
      }
      else {
        pbVar32 = pbVar38;
        for (uVar48 = 0; uVar41 != uVar48; uVar48 = uVar48 + 1) {
          *(byte *)((long)left_data + uVar48 + 0x10) = *pbVar32;
          pbVar32 = pbVar32 + lVar54;
        }
        if (iVar45 < (int)bs1) {
          puVar34 = (uint16_t *)((long)puVar34 + uVar41);
          sVar36 = (size_t)(int)(bs1 - iVar45);
          bVar49 = *(byte *)((long)left_data + uVar41 + 0xf);
LAB_00237678:
          memset(puVar34,(uint)bVar49,sVar36);
        }
      }
    }
    puVar34 = left_data_2 + 8;
    if ((bVar56 & 4) != 0) {
      memset(left_data_2,0x7f,0xa0);
      if (iVar10 < 1) {
        if (0 < iVar45) {
          bVar49 = *pbVar38;
          puVar17 = puVar34;
          goto LAB_002377ad;
        }
      }
      else {
        memcpy(puVar34,pbVar53,__n_00);
        if (iVar10 < (int)uVar26) {
          __n = (size_t)(int)(uVar26 - iVar10);
          bVar49 = *(byte *)((long)left_data_2 + __n_00 + 0xf);
          puVar17 = (uint16_t *)((long)puVar34 + __n_00);
LAB_002377ad:
          memset(puVar17,(uint)bVar49,__n);
        }
      }
    }
    if ((bVar56 & 0x10) != 0) {
      if ((iVar10 < 1) || (iVar45 < 1)) {
        if ((iVar10 < 1) &&
           (left_data_2[7]._1_1_ = 0x80, pbVar53 = pbVar38,
           left_data[7]._1_1_ = left_data_2[7]._1_1_, iVar45 < 1)) goto LAB_002377ff;
      }
      else {
        pbVar53 = pbVar53 + -1;
      }
      left_data_2[7]._1_1_ = *pbVar53;
      left_data[7]._1_1_ = left_data_2[7]._1_1_;
    }
LAB_002377ff:
    if (mode == '\0') {
      pap_Var12 = dc_pred[0 < iVar45] + (0 < iVar10);
    }
    else {
      pap_Var12 = pred + uVar46;
    }
    (*(*pap_Var12)[uVar27])(dst,(long)dst_stride,(uint8_t *)puVar34,(uint8_t *)(left_data + 8));
    return;
  }
  uVar23 = col_off + tx_size_wide_unit[uVar27];
  uVar25 = uVar25 - bs1;
  uVar35 = -xd->mb_to_top_edge >> 5;
  if ((int)uVar25 < 1) {
    bVar55 = false;
  }
  else {
    bVar55 = (int)((tx_size_high_unit[uVar27] + row_off << (bVar37 & 0x1f)) + uVar35) <
             (xd->tile).mi_row_end;
  }
  BVar57 = pMVar11->bsize;
  if (iVar51 != 0 || iVar42 != 0) {
    if (BVar57 == BLOCK_16X4) {
      BVar20 = BLOCK_16X8;
      if (iVar42 != 1) {
        BVar20 = BLOCK_16X4;
      }
      BVar57 = BLOCK_16X4;
      if (iVar51 == 1) {
        BVar57 = BVar20;
      }
LAB_00237280:
      if (iVar51 != 1) {
        BVar57 = BVar20;
      }
    }
    else if (BVar57 == BLOCK_4X8) {
      BVar57 = (iVar51 == 1) * '\x02' + BLOCK_4X8;
    }
    else {
      if (BVar57 == BLOCK_8X4) {
        bVar19 = iVar51 == 1 && iVar42 == 1;
        BVar57 = iVar42 == 1 | BLOCK_8X4;
      }
      else {
        if (BVar57 == BLOCK_4X16) {
          BVar20 = BLOCK_4X16;
          BVar57 = BLOCK_8X16;
          goto LAB_00237280;
        }
        if (BVar57 != BLOCK_4X4) goto LAB_00237284;
        BVar57 = iVar42 == 1;
        bVar19 = iVar51 == 1 && (bool)BVar57;
      }
      if (iVar51 == 1) {
        BVar57 = bVar19 | BLOCK_8X4;
      }
    }
  }
LAB_00237284:
  bVar2 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar46];
  angle = 0;
  bVar44 = bVar2 & 0x20;
  bVar21 = bVar2 & 8;
  if (filter_intra_mode != '\x05') {
    bVar44 = 0;
    bVar21 = 0;
  }
  if ((byte)(mode - 1) < 8) {
    angle = (uint)""[uVar46] + angle_delta;
    bVar21 = (int)angle < 0x5a;
    bVar44 = 0xb4 < (int)angle;
  }
  uVar40 = -xd->mb_to_left_edge >> 5;
  uVar52 = 0xffffffff;
  uVar16 = 0xffffffff;
  if ((bVar21 != 0) &&
     (uVar52 = 0,
     cVar1 == '\x01' && (int)((uVar23 << (bVar49 & 0x1f)) + uVar40) < (xd->tile).mi_col_end)) {
    uVar52 = 1;
    uVar15 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [BVar57] >> (bVar49 & 0x1f));
    iVar42 = uVar15 + (uVar15 == 0);
    if (row_off < 1) {
      if (iVar42 <= (int)uVar23) {
        uVar23 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [sb_size] - 1;
        iVar51 = (int)(uVar23 & uVar35) >> (""[BVar57] & 0x1f);
        bVar21 = ""[BVar57];
        iVar42 = (int)(uVar23 & uVar40) >> (bVar21 & 0x1f);
        if ((iVar51 != 0) &&
           (uVar52 = 0,
           iVar42 + 1 << (bVar21 & 0x1f) <
           (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [sb_size])) {
          uVar23 = (iVar51 << (5 - bVar21 & 0x1f)) + iVar42;
          ppuVar31 = has_tr_tables;
          if ((pMVar11->partition & 0xfe) == 6) {
            ppuVar31 = has_tr_vert_tables;
          }
          uVar52 = (uint)((ppuVar31[BVar57][(int)uVar23 / 8] >> (uVar23 & 7) & 1) != 0);
        }
      }
    }
    else {
      if ((BVar57 & ~BLOCK_4X8) == BLOCK_128X64) {
        uVar15 = 0x10 >> (bVar49 & 0x1f);
        if (uVar23 == uVar15 && 0x10U >> (bVar37 & 0x1f) == row_off) goto LAB_0023747d;
        iVar42 = col_off % (int)uVar15 + tx_size_wide_unit[uVar27];
        bVar19 = SBORROW4(iVar42,uVar15);
        iVar42 = iVar42 - uVar15;
      }
      else {
        bVar19 = SBORROW4(uVar23,iVar42);
        iVar42 = uVar23 - iVar42;
      }
      uVar52 = (uint)(bVar19 != iVar42 < 0);
    }
  }
LAB_0023747d:
  if ((bVar44 != 0) && (uVar16 = 0, (bVar56 & bVar55) == 1)) {
    if ((col_off < 1) || ((BVar57 & ~BLOCK_4X8) != BLOCK_128X64)) {
      if (col_off < 1) {
        uVar23 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [BVar57] >> (bVar37 & 0x1f));
        if (row_off + tx_size_high_unit[uVar27] < (int)(uVar23 + (uVar23 == 0))) {
          uVar16 = 1;
        }
        else {
          bVar56 = ""[BVar57];
          bVar49 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [sb_size];
          iVar51 = (int)(uVar35 & bVar49 - 1) >> (bVar56 & 0x1f);
          iVar42 = (int)(uVar40 & bVar49 - 1) >> (""[BVar57] & 0x1f);
          if (iVar42 == 0) {
            uVar16 = (uint)(((iVar51 << (bVar56 & 0x1f)) >> (bVar37 & 0x1f)) +
                            row_off + tx_size_high_unit[uVar27] <
                           (int)(uint)(bVar49 >> (bVar37 & 0x1f)));
          }
          else if (iVar51 + 1 << (bVar56 & 0x1f) < (int)(uint)bVar49) {
            uVar23 = (iVar51 << (5 - ""[BVar57] & 0x1f)) + iVar42;
            ppuVar31 = has_bl_tables;
            if ((pMVar11->partition & 0xfe) == 6) {
              ppuVar31 = has_bl_vert_tables;
            }
            bVar55 = (ppuVar31[BVar57][(int)uVar23 / 8] >> (uVar23 & 7) & 1) != 0;
            goto LAB_00237516;
          }
        }
      }
    }
    else if (((0x10U >> (bVar49 & 0x1f)) + 0x7fffffff & col_off) == 0) {
      uVar35 = 0x10 >> (bVar37 & 0x1f);
      uVar23 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [BVar57] >> (bVar37 & 0x1f));
      if (uVar35 <= uVar23) {
        uVar23 = uVar35;
      }
      bVar55 = row_off % (int)uVar35 + tx_size_high_unit[uVar27] < (int)uVar23;
LAB_00237516:
      uVar16 = (uint)bVar55;
    }
  }
  pMVar11 = (MB_MODE_INFO *)xd->block_ref_scale_factors[(ulong)(plane != 0) * 2 + -8];
  if (((MB_MODE_INFO *)xd->block_ref_scale_factors[(ulong)(plane != 0) * 2 + -7] ==
       (MB_MODE_INFO *)0x0) ||
     (iVar42 = is_smooth((MB_MODE_INFO *)xd->block_ref_scale_factors[(ulong)(plane != 0) * 2 + -7],
                         plane), iVar42 == 0)) {
    if (pMVar11 == (MB_MODE_INFO *)0x0) {
      local_c04 = 0;
    }
    else {
      local_c04 = is_smooth(pMVar11,plane);
    }
  }
  else {
    local_c04 = 1;
  }
  uVar23 = uVar39 - uVar26;
  if ((int)uVar26 < (int)(uVar39 - uVar26)) {
    uVar23 = uVar26;
  }
  if ((int)uVar52 < 1) {
    uVar23 = uVar52;
  }
  if ((int)bs1 < (int)uVar25) {
    uVar25 = bs1;
  }
  if ((int)uVar16 < 1) {
    uVar25 = uVar16;
  }
  if ((uVar50 & 1) != 0) {
    uVar50 = xd->bd;
    lVar28 = (long)ref * 2;
    uVar14 = (uint16_t)(0x80 << ((char)uVar50 - 8U & 0x1f));
    for (lVar24 = 0; lVar24 != 0xa0; lVar24 = lVar24 + 1) {
      left_data_2[lVar24] = uVar14 + 1;
    }
    dst = (uint8_t *)((long)dst * 2);
    uVar22 = uVar14 - 1;
    for (lVar24 = 0; lVar24 != 0xa0; lVar24 = lVar24 + 1) {
      auStack_9f8[lVar24] = uVar22;
    }
    if ((byte)(mode - 9) < 0xf8) {
      bVar37 = bVar2 & 0x10;
      bVar49 = bVar2 & 2;
      bVar56 = bVar2 & 4;
    }
    else if ((int)angle < 0x5b) {
      bVar37 = 1;
      bVar49 = 0;
      bVar56 = bVar37;
    }
    else {
      bVar56 = angle < 0xb4;
      bVar37 = 1;
      bVar49 = bVar37;
    }
    puVar34 = (uint16_t *)(lVar28 + -2);
    puVar17 = (uint16_t *)(lVar28 + lVar54 * -2);
    if (filter_intra_mode != '\x05') {
      bVar49 = 1;
      bVar56 = 1;
    }
    if ((bVar56 == 0 && iVar45 == 0) || (bVar49 == 0 && iVar10 == 0)) {
      if (bVar49 != 0) {
        puVar34 = puVar17;
        iVar45 = iVar10;
        uVar22 = uVar14 + 1;
      }
      if (0 < iVar45) {
        uVar22 = *puVar34;
      }
      uVar26 = 0;
      if ((int)bs1 < 1) {
        bs1 = 0;
      }
      for (; uVar26 != bs1; uVar26 = uVar26 + 1) {
        for (sVar36 = 0; __n != sVar36; sVar36 = sVar36 + 1) {
          *(uint16_t *)((long)dst + sVar36 * 2) = uVar22;
        }
        dst = (uint8_t *)((long)dst + (long)dst_stride * 2);
      }
      return;
    }
    if (bVar49 != 0) {
      uVar39 = 0;
      if (-1 < (int)uVar25) {
        uVar39 = uVar26;
      }
      iVar42 = uVar39 + bs1;
      if (iVar45 < 1) {
        if (0 < iVar10) {
          uVar22 = *puVar17;
          for (lVar54 = 0; iVar42 != lVar54; lVar54 = lVar54 + 1) {
            left_data_2[lVar54 + 0x10] = uVar22;
          }
        }
      }
      else {
        puVar43 = puVar34;
        for (uVar46 = 0; uVar41 != uVar46; uVar46 = uVar46 + 1) {
          left_data_2[uVar46 + 0x10] = *puVar43;
          puVar43 = puVar43 + lVar54;
        }
        iVar51 = iVar45;
        if (0 < (int)uVar25) {
          puVar43 = (uint16_t *)(lVar28 + lVar54 * uVar41 * 2 + -2);
          for (; (long)uVar41 < (long)(int)(uVar25 + bs1); uVar41 = uVar41 + 1) {
            left_data_2[uVar41 + 0x10] = *puVar43;
            puVar43 = puVar43 + lVar54;
          }
          iVar51 = (int)uVar41;
        }
        if (iVar51 < iVar42) {
          lVar54 = (long)iVar51;
          uVar22 = left_data_2[lVar54 + 0xf];
          for (; iVar42 != lVar54; lVar54 = lVar54 + 1) {
            left_data_2[lVar54 + 0x10] = uVar22;
          }
        }
      }
    }
    if (bVar56 != 0) {
      uVar25 = 0;
      if (-1 < (int)uVar23) {
        uVar25 = bs1;
      }
      iVar42 = uVar25 + uVar26;
      if (iVar10 < 1) {
        if (0 < iVar45) {
          uVar22 = *puVar34;
          for (lVar54 = 0; iVar42 != lVar54; lVar54 = lVar54 + 1) {
            local_9d8[lVar54] = uVar22;
          }
        }
      }
      else {
        memcpy(local_9d8,puVar17,(ulong)(uint)(iVar10 * 2));
        if (0 < (int)uVar23) {
          memcpy(local_9d8 + __n,puVar17 + __n,(ulong)(uVar23 * 2));
          local_bac = uVar23 + iVar10;
        }
        if (iVar42 - local_bac != 0 && (int)local_bac <= iVar42) {
          uVar3 = local_9d8[(ulong)local_bac - 1];
          for (lVar54 = 0; (int)(iVar42 - local_bac) != lVar54; lVar54 = lVar54 + 1) {
            local_9d8[(ulong)local_bac + lVar54] = uVar3;
          }
        }
      }
    }
    puVar43 = left_data_2 + 0x10;
    if ((filter_intra_mode != '\x05') || (bVar37 != 0)) {
      if ((iVar10 < 1) || (iVar45 < 1)) {
        if ((0 < iVar10) || (puVar17 = puVar34, 0 < iVar45)) {
          uVar14 = *puVar17;
        }
      }
      else {
        uVar14 = puVar17[-1];
      }
      auStack_9f8[0xf] = uVar14;
      left_data_2[0xf] = uVar14;
      if (filter_intra_mode != '\x05') {
        lVar54 = 0;
        uVar27 = 0;
        if (0 < (int)bs1) {
          uVar27 = (ulong)bs1;
        }
        for (; uVar27 * 0x42 - lVar54 != 0; lVar54 = lVar54 + 0x42) {
          *(uint16_t *)((long)left_data + lVar54 + 0x42) = *puVar43;
          puVar43 = puVar43 + 1;
        }
        memcpy(left_data,auStack_9f8 + 0xf,__n * 2 + 2);
        lVar28 = (ulong)filter_intra_mode * 0x40;
        for (lVar54 = 1; lVar54 <= (long)sVar36; lVar54 = lVar54 + 2) {
          lVar18 = lVar54 + -1;
          for (lVar24 = 1; lVar24 <= (long)__n; lVar24 = lVar24 + 4) {
            uVar3 = (&uStack_8ba)[lVar18 * 0x21 + lVar24];
            uVar4 = left_data[lVar18 * 0x21 + lVar24];
            uVar5 = left_data[lVar18 * 0x21 + lVar24 + 1];
            uVar6 = left_data[lVar18 * 0x21 + lVar24 + 2];
            uVar7 = left_data[lVar18 * 0x21 + lVar24 + 3];
            uVar8 = (&uStack_8ba)[lVar54 * 0x21 + lVar24];
            uVar9 = (&uStack_8ba)[(lVar54 + 1) * 0x21 + lVar24];
            for (uVar41 = 0; uVar41 != 8; uVar41 = uVar41 + 1) {
              uVar14 = clip_pixel_highbd((int)((int)*(char *)(lVar28 + 0x4333f6 + uVar41 * 8) *
                                               (uint)uVar9 +
                                               (int)*(char *)(lVar28 + 0x4333f5 + uVar41 * 8) *
                                               (uint)uVar8 +
                                               (int)*(char *)(lVar28 + 0x4333f4 + uVar41 * 8) *
                                               (uint)uVar7 +
                                               (int)*(char *)(lVar28 + 0x4333f3 + uVar41 * 8) *
                                               (uint)uVar6 +
                                               (int)*(char *)(lVar28 + 0x4333f2 + uVar41 * 8) *
                                               (uint)uVar5 +
                                               (int)*(char *)(lVar28 + 0x4333f1 + uVar41 * 8) *
                                               (uint)uVar4 +
                                               (int)av1_filter_intra_taps[filter_intra_mode][uVar41]
                                                    [0] * (uint)uVar3 + 8) >> 4,uVar50);
              local_be0 = (int)lVar54;
              left_data[(ulong)(((uint)(uVar41 >> 2) & 0x3fffffff) + local_be0) * 0x21 +
                        (ulong)((int)lVar24 + ((uint)uVar41 & 3))] = uVar14;
            }
          }
        }
        for (lVar54 = 0; uVar27 * 0x42 != lVar54; lVar54 = lVar54 + 0x42) {
          memcpy(dst,(void *)((long)left_data + lVar54 + 0x44),__n * 2);
          dst = (uint8_t *)((long)dst + (long)dst_stride * 2);
        }
        return;
      }
    }
    if (enable_intra_edge_filter == 0) {
      uVar25 = 0;
      local_c00 = 0;
    }
    else {
      if ((angle != 0x5a) && (angle != 0xb4)) {
        if ((bVar56 != 0) && ((bVar49 != 0 && (0x17 < (int)(uVar26 + bs1))))) {
          left_data_2[0xf] =
               (uint16_t)
               (((uint)local_9d8[0] + (uint)left_data_2[0x10]) * 5 + (uint)auStack_9f8[0xf] * 6 + 8
               >> 4);
          auStack_9f8[0xf] = left_data_2[0xf];
        }
        if ((0 < iVar10) && (bVar56 != 0)) {
          iVar42 = intra_edge_filter_strength(uVar26,bs1,angle - 0x5a,local_c04);
          uVar25 = 0;
          if ((int)angle < 0x5a) {
            uVar25 = bs1;
          }
          (*av1_highbd_filter_intra_edge)(auStack_9f8 + 0xf,iVar10 + 1 + uVar25,iVar42);
        }
        if ((0 < iVar45) && (bVar49 != 0)) {
          iVar42 = intra_edge_filter_strength(bs1,uVar26,angle - 0xb4,local_c04);
          uVar25 = 0;
          if (0xb4 < (int)angle) {
            uVar25 = uVar26;
          }
          (*av1_highbd_filter_intra_edge)(left_data_2 + 0xf,iVar45 + 1 + uVar25,iVar42);
        }
      }
      uVar39 = angle - 0x5a;
      uVar25 = -uVar39;
      if (0 < (int)uVar39) {
        uVar25 = uVar39;
      }
      local_c00 = 0;
      if ((uVar39 != 0) && (local_c00 = 0, uVar25 < 0x28)) {
        iVar42 = (uint)(local_c04 == 0) * 8 + 9;
        local_c00 = (uint)((int)(uVar26 + bs1) < iVar42);
        if ((bVar56 != 0) && ((int)(uVar26 + bs1) < iVar42)) {
          uVar25 = 0;
          if ((int)angle < 0x5a) {
            uVar25 = bs1;
          }
          (*av1_highbd_upsample_intra_edge)(local_9d8,uVar25 + uVar26,uVar50);
          local_c00 = 1;
        }
      }
      uVar39 = angle - 0xb4;
      uVar25 = -uVar39;
      if (0 < (int)uVar39) {
        uVar25 = uVar39;
      }
      if ((uVar39 == 0) || (0x27 < uVar25)) {
        uVar25 = 0;
      }
      else {
        iVar42 = (uint)(local_c04 == 0) * 8 + 9;
        uVar25 = (uint)((int)(uVar26 + bs1) < iVar42);
        if ((bVar49 != 0) && ((int)(uVar26 + bs1) < iVar42)) {
          uVar25 = 0;
          if (0xb4 < (int)angle) {
            uVar25 = uVar26;
          }
          (*av1_highbd_upsample_intra_edge)(puVar43,uVar25 + bs1,uVar50);
          uVar25 = 1;
        }
      }
    }
    lVar54 = (long)dst_stride;
    uVar39 = av1_get_dx(angle);
    uVar23 = av1_get_dy(angle);
    if (angle - 1 < 0x59) {
      puVar34 = local_9d8;
      pp_Var47 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
                 &av1_highbd_dr_prediction_z1;
      uVar25 = local_c00;
    }
    else {
      if (angle - 0x5b < 0x59) {
        (*av1_highbd_dr_prediction_z2)
                  ((uint16_t *)dst,lVar54,uVar26,bs1,local_9d8,puVar43,local_c00,uVar25,uVar39,
                   uVar23,uVar50);
        return;
      }
      if (0x58 < angle - 0xb5) {
        if (angle == 0xb4) {
          (*pred_high[2][uVar27])((uint16_t *)dst,lVar54,local_9d8,puVar43,uVar50);
          return;
        }
        if (angle != 0x5a) {
          return;
        }
        (*pred_high[1][uVar27])((uint16_t *)dst,lVar54,local_9d8,puVar43,uVar50);
        return;
      }
      puVar34 = local_9d8;
      pp_Var47 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
                 &av1_highbd_dr_prediction_z3;
    }
    goto LAB_00238a0f;
  }
  memset(left_data,0x81,0xa0);
  memset(left_data_2,0x7f,0xa0);
  if ((byte)(mode - 9) < 0xf8) {
    bVar56 = bVar2 & 2;
    bVar49 = bVar2 & 4;
    bVar2 = bVar2 & 0x10;
  }
  else {
    bVar56 = 0x5a < (int)angle;
    bVar49 = (int)angle < 0xb4;
    bVar2 = 1;
  }
  pbVar38 = ref + -lVar54;
  pbVar53 = ref + -1;
  if (filter_intra_mode != '\x05') {
    bVar49 = 1;
    bVar56 = 1;
  }
  if ((bVar49 == 0 && iVar45 == 0) || (bVar56 == 0 && iVar10 == 0)) {
    if (bVar56 == 0) {
      if (iVar45 < 1) {
        bVar56 = 0x7f;
        goto LAB_00237e5d;
      }
    }
    else {
      pbVar53 = pbVar38;
      if (iVar10 < 1) {
        bVar56 = 0x81;
        goto LAB_00237e5d;
      }
    }
    bVar56 = *pbVar53;
LAB_00237e5d:
    uVar26 = 0;
    if (0 < (int)bs1) {
      uVar26 = bs1;
    }
    while (uVar26 != 0) {
      memset(dst,(uint)bVar56,__n);
      dst = dst + dst_stride;
      uVar26 = uVar26 - 1;
    }
    return;
  }
  puVar34 = left_data + 8;
  if (bVar56 != 0) {
    uVar50 = 0;
    if (-1 < (int)uVar25) {
      uVar50 = uVar26;
    }
    iVar42 = uVar50 + bs1;
    if (iVar45 < 1) {
      if (0 < iVar10) {
        bVar37 = *pbVar38;
        goto LAB_00237f40;
      }
    }
    else {
      pbVar32 = pbVar53;
      for (uVar46 = 0; uVar41 != uVar46; uVar46 = uVar46 + 1) {
        *(byte *)((long)left_data + uVar46 + 0x10) = *pbVar32;
        pbVar32 = pbVar32 + lVar54;
      }
      iVar51 = iVar45;
      if (0 < (int)uVar25) {
        puVar33 = ref + lVar54 * uVar41 + -1;
        for (; (long)uVar41 < (long)(int)(uVar25 + bs1); uVar41 = uVar41 + 1) {
          *(uint8_t *)((long)left_data + uVar41 + 0x10) = *puVar33;
          puVar33 = puVar33 + lVar54;
        }
        iVar51 = (int)uVar41;
      }
      if (iVar42 - iVar51 != 0 && iVar51 <= iVar42) {
        puVar34 = (uint16_t *)((long)left_data + (long)iVar51 + 0x10);
        bVar37 = *(byte *)((long)left_data + (long)iVar51 + 0xf);
        iVar42 = iVar42 - iVar51;
LAB_00237f40:
        memset(puVar34,(uint)bVar37,(long)iVar42);
      }
    }
  }
  puVar34 = left_data_2 + 8;
  if (bVar49 != 0) {
    uVar50 = 0;
    if (-1 < (int)uVar23) {
      uVar50 = bs1;
    }
    iVar42 = uVar50 + uVar26;
    if (iVar10 < 1) {
      if (0 < iVar45) {
        bVar37 = *pbVar53;
        goto LAB_00238103;
      }
    }
    else {
      memcpy(puVar34,pbVar38,__n_00);
      if (0 < (int)uVar23) {
        memcpy((void *)((long)left_data_2 + __n + 0x10),pbVar38 + __n,(ulong)uVar23);
        local_bac = uVar23 + iVar10;
      }
      if (iVar42 - local_bac != 0 && (int)local_bac <= iVar42) {
        puVar34 = (uint16_t *)((long)left_data_2 + (ulong)local_bac + 0x10);
        bVar37 = *(byte *)((long)left_data_2 + (ulong)local_bac + 0xf);
        iVar42 = iVar42 - local_bac;
LAB_00238103:
        memset(puVar34,(uint)bVar37,(long)iVar42);
      }
    }
  }
  if ((filter_intra_mode != '\x05') || (bVar2 != 0)) {
    if ((iVar10 < 1) || (iVar45 < 1)) {
      if ((0 < iVar10) || (left_data_2[7]._1_1_ = 0x80, pbVar38 = pbVar53, 0 < iVar45))
      goto LAB_00238143;
    }
    else {
      pbVar38 = pbVar38 + -1;
LAB_00238143:
      left_data_2[7]._1_1_ = *pbVar38;
    }
    left_data[7]._1_1_ = left_data_2[7]._1_1_;
    if (filter_intra_mode != '\x05') {
      (*av1_filter_intra_predictor)
                (dst,(long)dst_stride,tx_size,(uint8_t *)(left_data_2 + 8),
                 (uint8_t *)(left_data + 8),(uint)filter_intra_mode);
      return;
    }
  }
  if (enable_intra_edge_filter == 0) {
    uVar25 = 0;
LAB_00238448:
    uVar39 = 0;
  }
  else {
    if ((angle != 0x5a) && (angle != 0xb4)) {
      if ((bVar49 != 0) && ((bVar56 != 0 && (0x17 < (int)(uVar26 + bs1))))) {
        left_data_2[7]._1_1_ =
             (byte)(((uint)(byte)left_data_2[8] + (uint)(byte)left_data[8]) * 5 +
                    (uint)left_data_2[7]._1_1_ * 6 + 8 >> 4);
        left_data[7]._1_1_ = left_data_2[7]._1_1_;
      }
      if ((0 < iVar10) && (bVar49 != 0)) {
        iVar42 = intra_edge_filter_strength(uVar26,bs1,angle - 0x5a,local_c04);
        uVar50 = 0;
        if ((int)angle < 0x5a) {
          uVar50 = bs1;
        }
        (*av1_filter_intra_edge)((uint8_t *)((long)left_data_2 + 0xf),iVar10 + 1 + uVar50,iVar42);
      }
      if ((0 < iVar45) && (bVar56 != 0)) {
        iVar42 = intra_edge_filter_strength(bs1,uVar26,angle - 0xb4,local_c04);
        uVar50 = 0;
        if (0xb4 < (int)angle) {
          uVar50 = uVar26;
        }
        (*av1_filter_intra_edge)((uint8_t *)((long)left_data + 0xf),iVar45 + 1 + uVar50,iVar42);
      }
    }
    uVar39 = angle - 0x5a;
    uVar50 = -uVar39;
    if (0 < (int)uVar39) {
      uVar50 = uVar39;
    }
    uVar25 = 0;
    if ((uVar39 != 0) && (uVar25 = 0, uVar50 < 0x28)) {
      iVar42 = (uint)(local_c04 == 0) * 8 + 9;
      uVar25 = (uint)((int)(uVar26 + bs1) < iVar42);
      if ((bVar49 != 0) && ((int)(uVar26 + bs1) < iVar42)) {
        uVar50 = 0;
        if ((int)angle < 0x5a) {
          uVar50 = bs1;
        }
        (*av1_upsample_intra_edge)((uint8_t *)(left_data_2 + 8),uVar50 + uVar26);
        uVar25 = 1;
      }
    }
    uVar39 = angle - 0xb4;
    uVar50 = -uVar39;
    if (0 < (int)uVar39) {
      uVar50 = uVar39;
    }
    if (uVar39 == 0) goto LAB_00238448;
    if (uVar50 < 0x28) {
      iVar42 = (uint)(local_c04 == 0) * 8 + 9;
      uVar39 = (uint)((int)(uVar26 + bs1) < iVar42);
      if ((bVar56 != 0) && ((int)(uVar26 + bs1) < iVar42)) {
        uVar50 = 0;
        if (0xb4 < (int)angle) {
          uVar50 = uVar26;
        }
        (*av1_upsample_intra_edge)((uint8_t *)(left_data + 8),uVar50 + bs1);
        uVar39 = 1;
      }
    }
    else {
      uVar39 = 0;
    }
  }
  uVar23 = av1_get_dx(angle);
  uVar50 = 0x238467;
  uVar35 = av1_get_dy(angle);
  if (angle - 1 < 0x59) {
    pp_Var47 = &av1_dr_prediction_z1;
    puVar34 = left_data_2 + 8;
    puVar43 = left_data + 8;
    uVar39 = uVar23;
    uVar23 = uVar35;
  }
  else if (angle - 0x5b < 0x59) {
    puVar34 = left_data_2 + 8;
    puVar43 = left_data + 8;
    pp_Var47 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
               &av1_dr_prediction_z2;
    uVar50 = uVar35;
  }
  else {
    if (0x58 < angle - 0xb5) {
      if (angle == 0xb4) {
        (*pred[2][uVar27])(dst,(long)dst_stride,(uint8_t *)(left_data_2 + 8),
                           (uint8_t *)(left_data + 8));
        return;
      }
      if (angle != 0x5a) {
        return;
      }
      (*pred[1][uVar27])(dst,(long)dst_stride,(uint8_t *)(left_data_2 + 8),
                         (uint8_t *)(left_data + 8));
      return;
    }
    pp_Var47 = &av1_dr_prediction_z3;
    puVar34 = left_data_2 + 8;
    puVar43 = left_data + 8;
    uVar25 = uVar39;
    uVar39 = uVar23;
    uVar23 = uVar35;
  }
LAB_00238a0f:
  (**pp_Var47)((uint16_t *)dst,(long)dst_stride,uVar26,bs1,puVar34,puVar43,uVar25,uVar39,uVar23,
               uVar50);
  return;
}

Assistant:

void av1_predict_intra_block(const MACROBLOCKD *xd, BLOCK_SIZE sb_size,
                             int enable_intra_edge_filter, int wpx, int hpx,
                             TX_SIZE tx_size, PREDICTION_MODE mode,
                             int angle_delta, int use_palette,
                             FILTER_INTRA_MODE filter_intra_mode,
                             const uint8_t *ref, int ref_stride, uint8_t *dst,
                             int dst_stride, int col_off, int row_off,
                             int plane) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  const int x = col_off << MI_SIZE_LOG2;
  const int y = row_off << MI_SIZE_LOG2;
  const int is_hbd = is_cur_buf_hbd(xd);

  assert(mode < INTRA_MODES);

  if (use_palette) {
    int r, c;
    const uint8_t *const map = xd->plane[plane != 0].color_index_map +
                               xd->color_index_map_offset[plane != 0];
    const uint16_t *const palette =
        mbmi->palette_mode_info.palette_colors + plane * PALETTE_MAX_SIZE;
    if (is_hbd) {
      uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst16[r * dst_stride + c] = palette[map[(r + y) * wpx + c + x]];
        }
      }
    } else {
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst[r * dst_stride + c] =
              (uint8_t)palette[map[(r + y) * wpx + c + x]];
        }
      }
    }
    return;
  }

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  const int have_top =
      row_off || (ss_y ? xd->chroma_up_available : xd->up_available);
  const int have_left =
      col_off || (ss_x ? xd->chroma_left_available : xd->left_available);

  // Distance between the right edge of this prediction block to
  // the frame right edge
  const int xr = (xd->mb_to_right_edge >> (3 + ss_x)) + wpx - x - txwpx;
  // Distance between the bottom edge of this prediction block to
  // the frame bottom edge
  const int yd = (xd->mb_to_bottom_edge >> (3 + ss_y)) + hpx - y - txhpx;
  const int use_filter_intra = filter_intra_mode != FILTER_INTRA_MODES;
  const int is_dr_mode = av1_is_directional_mode(mode);

  // The computations in this function, as well as in build_intra_predictors(),
  // are generalized for all intra modes. Some of these operations are not
  // required since non-directional intra modes (i.e., DC, SMOOTH, SMOOTH_H,
  // SMOOTH_V, and PAETH) specifically require left and top neighbors. Hence, a
  // separate function build_non_directional_intra_predictors() is introduced
  // for these modes to avoid redundant computations while generating pred data.

  const int n_top_px = have_top ? AOMMIN(txwpx, xr + txwpx) : 0;
  const int n_left_px = have_left ? AOMMIN(txhpx, yd + txhpx) : 0;
  if (!use_filter_intra && !is_dr_mode) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_hbd) {
      highbd_build_non_directional_intra_predictors(
          ref, ref_stride, dst, dst_stride, mode, tx_size, n_top_px, n_left_px,
          xd->bd);
      return;
    }
#endif  // CONFIG_AV1_HIGHBITDEPTH
    build_non_directional_intra_predictors(ref, ref_stride, dst, dst_stride,
                                           mode, tx_size, n_top_px, n_left_px);
    return;
  }

  const int txw = tx_size_wide_unit[tx_size];
  const int txh = tx_size_high_unit[tx_size];
  const int mi_row = -xd->mb_to_top_edge >> (3 + MI_SIZE_LOG2);
  const int mi_col = -xd->mb_to_left_edge >> (3 + MI_SIZE_LOG2);
  const int right_available =
      mi_col + ((col_off + txw) << ss_x) < xd->tile.mi_col_end;
  const int bottom_available =
      (yd > 0) && (mi_row + ((row_off + txh) << ss_y) < xd->tile.mi_row_end);

  const PARTITION_TYPE partition = mbmi->partition;

  BLOCK_SIZE bsize = mbmi->bsize;
  // force 4x4 chroma component block size.
  if (ss_x || ss_y) {
    bsize = scale_chroma_bsize(bsize, ss_x, ss_y);
  }

  int p_angle = 0;
  int need_top_right = extend_modes[mode] & NEED_ABOVERIGHT;
  int need_bottom_left = extend_modes[mode] & NEED_BOTTOMLEFT;

  if (use_filter_intra) {
    need_top_right = 0;
    need_bottom_left = 0;
  }
  if (is_dr_mode) {
    p_angle = mode_to_angle_map[mode] + angle_delta;
    need_top_right = p_angle < 90;
    need_bottom_left = p_angle > 180;
  }

  // Possible states for have_top_right(TR) and have_bottom_left(BL)
  // -1 : TR and BL are not needed
  //  0 : TR and BL are needed but not available
  // > 0 : TR and BL are needed and pixels are available
  const int have_top_right =
      need_top_right ? has_top_right(sb_size, bsize, mi_row, mi_col, have_top,
                                     right_available, partition, tx_size,
                                     row_off, col_off, ss_x, ss_y)
                     : -1;
  const int have_bottom_left =
      need_bottom_left ? has_bottom_left(sb_size, bsize, mi_row, mi_col,
                                         bottom_available, have_left, partition,
                                         tx_size, row_off, col_off, ss_x, ss_y)
                       : -1;

  const int disable_edge_filter = !enable_intra_edge_filter;
  const int intra_edge_filter_type = get_intra_edge_filter_type(xd, plane);
  const int n_topright_px =
      have_top_right > 0 ? AOMMIN(txwpx, xr) : have_top_right;
  const int n_bottomleft_px =
      have_bottom_left > 0 ? AOMMIN(txhpx, yd) : have_bottom_left;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_hbd) {
    highbd_build_directional_and_filter_intra_predictors(
        ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
        tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
        n_bottomleft_px, intra_edge_filter_type, xd->bd);
    return;
  }
#endif
  build_directional_and_filter_intra_predictors(
      ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
      tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
      n_bottomleft_px, intra_edge_filter_type);
}